

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_modern_uniform(CompilerHLSL *this,SPIRVariable *var)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  undefined1 local_288 [64];
  undefined1 local_248 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  undefined1 local_1e8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [36];
  uint32_t local_184;
  undefined1 local_180 [64];
  undefined1 local_140 [32];
  undefined1 local_120 [64];
  undefined1 local_e0 [32];
  undefined1 local_c0 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  undefined1 local_50 [47];
  bool local_21;
  SPIRType *pSStack_20;
  bool is_coherent;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  pSStack_20 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar3);
  if (pSStack_20->basetype - Image < 2) {
    local_21 = false;
    if ((pSStack_20->basetype == Image) && ((pSStack_20->image).sampled == 2)) {
      local_50._40_4_ = (type->super_IVariant).self.id;
      local_21 = Compiler::has_decoration((Compiler *)this,(ID)local_50._40_4_,DecorationCoherent);
    }
    pSVar1 = pSStack_20;
    local_50._32_8_ = "";
    if (local_21 != false) {
      local_50._32_8_ = "globallycoherent ";
    }
    TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    image_type_hlsl_modern_abi_cxx11_((CompilerHLSL *)local_50,(SPIRType *)this,(uint32_t)pSVar1);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_70,this,(ulong)uVar3,1);
    pSVar1 = pSStack_20;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              (local_c0 + 0x20,this,pSVar1,(ulong)uVar3);
    to_resource_binding_abi_cxx11_((CompilerHLSL *)local_c0,(SPIRVariable *)this);
    CompilerGLSL::
    statement<char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,(char **)(local_50 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [2])0x40c6cb,local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_c0 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_c0);
    ::std::__cxx11::string::~string((string *)(local_c0 + 0x20));
    ::std::__cxx11::string::~string((string *)local_70);
    ::std::__cxx11::string::~string((string *)local_50);
    pSVar1 = pSStack_20;
    if ((pSStack_20->basetype == SampledImage) && ((pSStack_20->image).dim != DimBuffer)) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      bVar2 = Compiler::is_depth_image((Compiler *)this,pSVar1,uVar3);
      if (bVar2) {
        TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        to_sampler_expression_abi_cxx11_((CompilerHLSL *)local_e0,(uint32_t)this);
        pSVar1 = pSStack_20;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (local_120 + 0x20,this,pSVar1,(ulong)uVar3);
        to_resource_binding_sampler_abi_cxx11_((CompilerHLSL *)local_120,(SPIRVariable *)this);
        CompilerGLSL::
        statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_120 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)local_120);
        ::std::__cxx11::string::~string((string *)(local_120 + 0x20));
        ::std::__cxx11::string::~string((string *)local_e0);
      }
      else {
        TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        to_sampler_expression_abi_cxx11_((CompilerHLSL *)local_140,(uint32_t)this);
        pSVar1 = pSStack_20;
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                  (local_180 + 0x20,this,pSVar1,(ulong)uVar3);
        to_resource_binding_sampler_abi_cxx11_((CompilerHLSL *)local_180,(SPIRVariable *)this);
        CompilerGLSL::
        statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_180 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                   (char (*) [2])0x42463b);
        ::std::__cxx11::string::~string((string *)local_180);
        ::std::__cxx11::string::~string((string *)(local_180 + 0x20));
        ::std::__cxx11::string::~string((string *)local_140);
      }
    }
  }
  else if (pSStack_20->basetype == Sampler) {
    local_184 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    sVar4 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.comparison_ids,&local_184);
    if (sVar4 == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_208,this,(ulong)uVar3,1);
      pSVar1 = pSStack_20;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (local_248 + 0x20,this,pSVar1,(ulong)uVar3);
      to_resource_binding_abi_cxx11_((CompilerHLSL *)local_248,(SPIRVariable *)this);
      CompilerGLSL::
      statement<char_const(&)[14],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [14])"SamplerState ",local_208,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_248 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_248);
      ::std::__cxx11::string::~string((string *)(local_248 + 0x20));
      ::std::__cxx11::string::~string((string *)local_208);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_1a8,this,(ulong)uVar3,1);
      pSVar1 = pSStack_20;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
                (local_1e8 + 0x20,this,pSVar1,(ulong)uVar3);
      to_resource_binding_abi_cxx11_((CompilerHLSL *)local_1e8,(SPIRVariable *)this);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"SamplerComparisonState ",local_1a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_1e8 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_1e8);
      ::std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
      ::std::__cxx11::string::~string((string *)local_1a8);
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x28])(local_288 + 0x20,this,type);
    to_resource_binding_abi_cxx11_((CompilerHLSL *)local_288,(SPIRVariable *)this);
    CompilerGLSL::statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_288 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288,
               (char (*) [2])0x42463b);
    ::std::__cxx11::string::~string((string *)local_288);
    ::std::__cxx11::string::~string((string *)(local_288 + 0x20));
  }
  return;
}

Assistant:

void CompilerHLSL::emit_modern_uniform(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	switch (type.basetype)
	{
	case SPIRType::SampledImage:
	case SPIRType::Image:
	{
		bool is_coherent = false;
		if (type.basetype == SPIRType::Image && type.image.sampled == 2)
			is_coherent = has_decoration(var.self, DecorationCoherent);

		statement(is_coherent ? "globallycoherent " : "", image_type_hlsl_modern(type, var.self), " ",
		          to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");

		if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		{
			// For combined image samplers, also emit a combined image sampler.
			if (is_depth_image(type, var.self))
				statement("SamplerComparisonState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
			else
				statement("SamplerState ", to_sampler_expression(var.self), type_to_array_glsl(type, var.self),
				          to_resource_binding_sampler(var), ";");
		}
		break;
	}

	case SPIRType::Sampler:
		if (comparison_ids.count(var.self))
			statement("SamplerComparisonState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var),
			          ";");
		else
			statement("SamplerState ", to_name(var.self), type_to_array_glsl(type, var.self), to_resource_binding(var), ";");
		break;

	default:
		statement(variable_decl(var), to_resource_binding(var), ";");
		break;
	}
}